

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cpp
# Opt level: O0

ptime booster::ptime::now(void)

{
  ptime pVar1;
  timeval tv;
  longlong in_stack_ffffffffffffffd8;
  ptime *in_stack_ffffffffffffffe0;
  undefined1 local_10 [12];
  
  gettimeofday((timeval *)&stack0xffffffffffffffe0,(__timezone_ptr_t)0x0);
  ptime(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  pVar1._12_4_ = 0;
  pVar1._0_12_ = local_10;
  return pVar1;
}

Assistant:

ptime ptime::now()
{
	#ifndef BOOSTER_WIN_NATIVE
	struct timeval tv;
	gettimeofday(&tv,0);
	return ptime(tv.tv_sec,tv.tv_usec * 1000);
	#else
	FILETIME ft;
	GetSystemTimeAsFileTime(&ft);
	unsigned long long tt = ft.dwHighDateTime;
	tt <<=32;
	tt |= ft.dwLowDateTime;
	tt /=10;
	tt -= 11644473600000000ULL;
	return ptime(ptime::microseconds(tt));
	#endif
}